

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemTxResult
memory_region_dispatch_read_mips64
          (uc_struct_conflict6 *uc,MemoryRegion *mr,hwaddr addr,uint64_t *pval,MemOp_conflict1 op,
          MemTxAttrs attrs)

{
  _Bool _Var1;
  uint size_00;
  uint64_t uVar2;
  MemTxResult r;
  uint size;
  MemOp_conflict1 op_local;
  uint64_t *pval_local;
  hwaddr addr_local;
  MemoryRegion *mr_local;
  uc_struct_conflict6 *uc_local;
  MemTxAttrs attrs_local;
  
  size_00 = memop_size(op);
  _Var1 = memory_region_access_valid_mips64(uc,mr,addr,size_00,false,attrs);
  if (_Var1) {
    uc_local._4_4_ = memory_region_dispatch_read1(uc,mr,addr,pval,size_00,attrs);
    adjust_endianness(mr,pval,op);
  }
  else {
    uVar2 = unassigned_mem_read(mr,addr,size_00);
    *pval = uVar2;
    uc_local._4_4_ = 2;
  }
  return uc_local._4_4_;
}

Assistant:

MemTxResult memory_region_dispatch_read(struct uc_struct *uc, MemoryRegion *mr,
                                        hwaddr addr,
                                        uint64_t *pval,
                                        MemOp op,
                                        MemTxAttrs attrs)
{
    unsigned size = memop_size(op);
    MemTxResult r;

    if (!memory_region_access_valid(uc, mr, addr, size, false, attrs)) {
        *pval = unassigned_mem_read(mr, addr, size);
        return MEMTX_DECODE_ERROR;
    }

    r = memory_region_dispatch_read1(uc, mr, addr, pval, size, attrs);
    adjust_endianness(mr, pval, op);
    return r;
}